

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O0

string * __thiscall LinearRegression::generatePrintFunction_abi_cxx11_(LinearRegression *this)

{
  long in_RSI;
  string *in_RDI;
  size_t var;
  string printGrad;
  string printParam;
  size_t in_stack_fffffffffffff828;
  undefined6 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff836;
  undefined1 in_stack_fffffffffffff837;
  string *__lhs;
  string local_7a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff860;
  LinearRegression *in_stack_fffffffffffff868;
  string local_788 [32];
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  ulong local_1a8;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  offset_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
  std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830
                                                )));
  std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830
                                                )));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xb0),100);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff868);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830
                                                )));
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  offset_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
  std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830
                                                )));
  std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830
                                                )));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xb0),100);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff868);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830
                                                )));
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_180);
  for (local_1a8 = 0; local_1a8 < 100; local_1a8 = local_1a8 + 1) {
    in_stack_fffffffffffff837 =
         std::bitset<100UL>::test
                   ((bitset<100UL> *)
                    CONCAT17(in_stack_fffffffffffff837,
                             CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)),
                    in_stack_fffffffffffff828);
    if ((bool)in_stack_fffffffffffff837) {
      in_stack_fffffffffffff836 =
           std::bitset<100UL>::test
                     ((bitset<100UL> *)
                      CONCAT17(in_stack_fffffffffffff837,
                               CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)),
                      in_stack_fffffffffffff828);
      if ((bool)in_stack_fffffffffffff836) {
        offset_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        getAttributeName_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        offset_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        getAttributeName_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        std::__cxx11::string::operator+=(local_30,local_3c8);
        std::__cxx11::string::~string(local_3c8);
        std::__cxx11::string::~string(local_3e8);
        std::__cxx11::string::~string(local_508);
        std::__cxx11::string::~string(local_408);
        std::__cxx11::string::~string(local_428);
        std::__cxx11::string::~string(local_4e8);
        std::__cxx11::string::~string(local_448);
        std::__cxx11::string::~string(local_468);
        std::__cxx11::string::~string(local_4c8);
        std::__cxx11::string::~string(local_488);
        std::__cxx11::string::~string(local_4a8);
        offset_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        getAttributeName_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        offset_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        getAttributeName_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        std::__cxx11::string::operator+=(local_100,local_528);
        std::__cxx11::string::~string(local_528);
        std::__cxx11::string::~string(local_548);
        std::__cxx11::string::~string(local_668);
        std::__cxx11::string::~string(local_568);
        std::__cxx11::string::~string(local_588);
        std::__cxx11::string::~string(local_648);
        std::__cxx11::string::~string(local_5a8);
        std::__cxx11::string::~string(local_5c8);
        std::__cxx11::string::~string(local_628);
        std::__cxx11::string::~string(local_5e8);
        std::__cxx11::string::~string(local_608);
      }
      else {
        offset_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        getAttributeName_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xb0),
                   local_1a8);
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff868);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        std::__cxx11::string::operator+=(local_30,local_1c8);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::string::~string(local_2a8);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string(local_228);
        std::__cxx11::string::~string(local_288);
        std::__cxx11::string::~string(local_248);
        std::__cxx11::string::~string(local_268);
        offset_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        getAttributeName_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xb0),
                   local_1a8);
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff868);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                              CONCAT16(in_stack_fffffffffffff836,
                                                       in_stack_fffffffffffff830)));
        std::__cxx11::string::operator+=(local_100,local_2c8);
        std::__cxx11::string::~string(local_2c8);
        std::__cxx11::string::~string(local_2e8);
        std::__cxx11::string::~string(local_3a8);
        std::__cxx11::string::~string(local_308);
        std::__cxx11::string::~string(local_328);
        std::__cxx11::string::~string(local_388);
        std::__cxx11::string::~string(local_348);
        std::__cxx11::string::~string(local_368);
      }
    }
  }
  offset_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
  std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830
                                                )));
  offset_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830
                                                )));
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff837,
                                CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
  std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830
                                                )));
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff837,
                                CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
  offset_abi_cxx11_(in_stack_fffffffffffff868,(size_t)in_stack_fffffffffffff860);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffff837,
                                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830
                                                )));
  std::__cxx11::string::~string(local_688);
  std::__cxx11::string::~string(local_7a8);
  std::__cxx11::string::~string(local_6a8);
  std::__cxx11::string::~string(local_6c8);
  std::__cxx11::string::~string(local_6e8);
  std::__cxx11::string::~string(local_708);
  std::__cxx11::string::~string(local_728);
  std::__cxx11::string::~string(local_788);
  std::__cxx11::string::~string(local_748);
  std::__cxx11::string::~string(local_768);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string LinearRegression::generatePrintFunction()
{
    std::string printParam = offset(2)+"std::cout << \"param_int = \" << "+
        "params["+std::to_string(_parameterIndex[NUM_OF_VARIABLES])+"] << \";\\n\";\n";
    
    std::string printGrad = offset(2)+"std::cout << \"grad_int = \" << "+
        "grad["+std::to_string(_parameterIndex[NUM_OF_VARIABLES])+"] << \";\\n\";\n";
    
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;

        if (!_categoricalFeatures.test(var))
        {
            printParam += offset(2)+"std::cout << \"param_"+getAttributeName(var)+" = "
                "\" << params["+std::to_string(_parameterIndex[var])+"] << \";\\n\";\n";
            printGrad += offset(2)+"std::cout << \"grad_"+getAttributeName(var)+" = "
                "\" << grad["+std::to_string(_parameterIndex[var])+"] <<\";\\n\";\n";
        }
        else
        {            
            printParam += offset(2)+"for (std::pair<int,size_t> tuple : index_"+
                getAttributeName(var)+")\n"+
                offset(3)+"std::cout << \"param_"+getAttributeName(var)+
                "[\"<< tuple.first <<\"] = \"<< params[tuple.second] << \";\\n\";\n";
            printGrad += offset(2)+"for (std::pair<int,size_t> tuple : index_"+
                getAttributeName(var)+")\n"+
                offset(3)+"std::cout << \"grad_"+getAttributeName(var)+
                "[\"<< tuple.first <<\"] = \"<< grad[tuple.second] << \";\\n\";\n";
        }
    }

    return offset(1)+"void printOutput()\n"+offset(1)+"{\n"+printParam+"\n"+
        printGrad+offset(1)+"}\n";
}